

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptSamplerTypeDX9(HlslGrammar *this,TType *type)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  int iVar3;
  undefined4 extraout_var;
  TSampler sampler;
  TType txType;
  TSampler local_15c;
  TType local_158;
  TType local_c0;
  
  EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  bVar1 = false;
  TType::TType(&local_158,EbtFloat,EvqUniform,4,0,0,false);
  if (EVar2 - EHTokSampler < 5) {
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    local_15c = (TSampler)
                ((uint)(byte)local_158._8_1_ |
                *(uint *)(&DAT_00852f10 + (ulong)(EVar2 - EHTokSampler) * 4));
    bVar1 = HlslParseContext::setTextureReturnType
                      (this->parseContext,&local_15c,&local_158,
                       &(this->super_HlslTokenStream).token.loc);
    if (bVar1) {
      local_c0._vptr_TType = (_func_int **)&PTR__TType_00af5e70;
      local_c0._8_4_ = 0x10e;
      local_c0.arraySizes = (TArraySizes *)0x0;
      local_c0.field_13.structure = (TTypeList *)0x0;
      local_c0.fieldName = (TString *)0x0;
      local_c0.typeName = (TString *)0x0;
      local_c0.sampler = local_15c;
      local_c0.typeParameters = (TTypeParameters *)0x0;
      local_c0.spirvType = (TSpirvType *)0x0;
      local_c0.qualifier.semanticName = (char *)0x0;
      local_c0.qualifier._16_1_ = 0;
      local_c0.qualifier.layoutOffset = -1;
      local_c0.qualifier.layoutAlign = -1;
      local_c0.qualifier.layoutPushConstant = false;
      local_c0.qualifier.layoutBufferReference = false;
      local_c0.qualifier.layoutPassthrough = false;
      local_c0.qualifier.layoutViewportRelative = false;
      local_c0.qualifier.layoutSecondaryViewportRelativeOffset = -0x800;
      local_c0.qualifier.layoutBindlessSampler = false;
      local_c0.qualifier.layoutBindlessImage = false;
      local_c0.qualifier.layoutShaderRecord = false;
      local_c0.qualifier.layoutFullQuads = false;
      local_c0.qualifier.layoutQuadDeriv = false;
      local_c0.qualifier.layoutHitObjectShaderRecordNV = false;
      local_c0.qualifier._44_1_ = 0;
      local_c0.qualifier._28_8_ = 0xffffffff001fcfff;
      local_c0.qualifier._36_8_ = 0xffffffffffffffff;
      local_c0.qualifier.spirvStorageClass = -1;
      local_c0.qualifier.spirvDecorate = (TSpirvDecorate *)0x0;
      local_c0.qualifier._8_8_ = 5;
      TType::shallowCopy(type,&local_c0);
      iVar3 = (*type->_vptr_TType[10])(type);
      *(undefined1 *)(CONCAT44(extraout_var,iVar3) + 0x2c) = 0;
    }
  }
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptSamplerTypeDX9(TType &type)
{
    // read sampler type
    const EHlslTokenClass samplerType = peek();

    TSamplerDim dim = EsdNone;
    TType txType(EbtFloat, EvqUniform, 4); // default type is float4

    bool isShadow = false;

    switch (samplerType)
    {
    case EHTokSampler:		dim = Esd2D;	break;
    case EHTokSampler1d:	dim = Esd1D;	break;
    case EHTokSampler2d:	dim = Esd2D;	break;
    case EHTokSampler3d:	dim = Esd3D;	break;
    case EHTokSamplerCube:	dim = EsdCube;	break;
    default:
        return false; // not a dx9 sampler declaration
    }

    advanceToken(); // consume the sampler type keyword

    TArraySizes *arraySizes = nullptr; // TODO: array

    TSampler sampler;
    sampler.set(txType.getBasicType(), dim, false, isShadow, false);

    if (!parseContext.setTextureReturnType(sampler, txType, token.loc))
        return false;

    type.shallowCopy(TType(sampler, EvqUniform, arraySizes));
    type.getQualifier().layoutFormat = ElfNone;

    return true;
}